

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.h
# Opt level: O3

void __thiscall spvtools::opt::IRContext::AnalyzeFeatures(IRContext *this)

{
  FeatureManager *__ptr;
  _Head_base<0UL,_spvtools::opt::FeatureManager_*,_false> this_00;
  
  this_00._M_head_impl = (FeatureManager *)operator_new(0x58);
  (this_00._M_head_impl)->grammar_ = &this->grammar_;
  *(undefined8 *)
   &((this_00._M_head_impl)->extensions_).buckets_.
    super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
    ._M_impl = 0;
  *(pointer *)((long)&((this_00._M_head_impl)->extensions_).buckets_ + 8) = (pointer)0x0;
  *(pointer *)((long)&((this_00._M_head_impl)->extensions_).buckets_ + 0x10) = (pointer)0x0;
  ((this_00._M_head_impl)->extensions_).size_ = 0;
  *(undefined8 *)
   &((this_00._M_head_impl)->capabilities_).buckets_.
    super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
    ._M_impl = 0;
  *(pointer *)((long)&((this_00._M_head_impl)->capabilities_).buckets_ + 8) = (pointer)0x0;
  *(pointer *)((long)&((this_00._M_head_impl)->capabilities_).buckets_ + 0x10) = (pointer)0x0;
  ((this_00._M_head_impl)->capabilities_).size_ = 0;
  *(undefined8 *)((long)&((this_00._M_head_impl)->capabilities_).size_ + 4) = 0;
  (this_00._M_head_impl)->extinst_importid_OpenCL100DebugInfo_ = 0;
  (this_00._M_head_impl)->extinst_importid_Shader100DebugInfo_ = 0;
  __ptr = (this->feature_mgr_)._M_t.
          super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
          .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
  (this->feature_mgr_)._M_t.
  super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
  .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl = this_00._M_head_impl
  ;
  if (__ptr != (FeatureManager *)0x0) {
    std::default_delete<spvtools::opt::FeatureManager>::operator()
              ((default_delete<spvtools::opt::FeatureManager> *)&this->feature_mgr_,__ptr);
    this_00._M_head_impl =
         (this->feature_mgr_)._M_t.
         super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
         ._M_t.
         super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
         .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
  }
  FeatureManager::Analyze
            (this_00._M_head_impl,
             (this->module_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
             .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl);
  return;
}

Assistant:

void AnalyzeFeatures() {
    feature_mgr_ =
        std::unique_ptr<FeatureManager>(new FeatureManager(grammar_));
    feature_mgr_->Analyze(module());
  }